

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToFloatingPoint<double>(floating_point<double> *f,iu_ostream *os)

{
  ulong uVar1;
  char cVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  char cVar8;
  iu_stringstream ss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  char local_1b8 [24];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x11;
  std::ostream::_M_insert<double>((f->m_v).fv);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(0x",3);
  uVar1 = (f->m_v).uv;
  pcVar6 = local_1b8;
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  lVar5 = 0x3c;
  do {
    uVar7 = (uint)(uVar1 >> ((byte)lVar5 & 0x3f)) & 0xf;
    cVar2 = (char)uVar7;
    cVar8 = cVar2 + '0';
    if (9 < uVar7) {
      cVar8 = cVar2 + '7';
    }
    *pcVar6 = cVar8;
    lVar5 = lVar5 + -4;
    pcVar6 = pcVar6 + 1;
  } while (lVar5 != -4);
  local_1b8[0x10] = 0;
  local_1f8 = local_1e8;
  sVar4 = strlen(local_1b8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,local_1b8,local_1b8 + sVar4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1f8,local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}